

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *in_R8;
  TimeInMillis local_70;
  string local_68;
  undefined1 local_38 [8];
  string counts;
  TestCase *test_case_local;
  PrettyUnitTestResultPrinter *this_local;
  
  if ((FLAGS_gtest_print_time & 1) != 0) {
    counts.field_2._8_8_ = test_case;
    uVar1 = TestCase::test_to_run_count(test_case);
    FormatCountableNoun_abi_cxx11_
              ((string *)local_38,(testing *)(ulong)uVar1,0x18ecc3,"tests",in_R8);
    ColoredPrintf(COLOR_GREEN,"[----------] ");
    uVar2 = std::__cxx11::string::c_str();
    pcVar3 = TestCase::name((TestCase *)counts.field_2._8_8_);
    local_70 = TestCase::elapsed_time((TestCase *)counts.field_2._8_8_);
    StreamableToString<long_long>(&local_68,&local_70);
    uVar4 = std::__cxx11::string::c_str();
    printf("%s from %s (%s ms total)\n\n",uVar2,pcVar3,uVar4);
    std::__cxx11::string::~string((string *)&local_68);
    fflush(_stdout);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case.name(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}